

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O3

void aom_calc_highbd_psnr
               (YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,PSNR_STATS *psnr,uint32_t bit_depth,
               uint32_t in_bit_depth)

{
  uint height;
  int width;
  uint64_t uVar1;
  int64_t iVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined4 in_register_00000084;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int b_strides [3];
  int a_strides [3];
  int heights [3];
  int widths [3];
  int local_80 [6];
  PSNR_STATS *local_68;
  uint local_60 [6];
  undefined8 local_48;
  double local_40;
  uint64_t local_38;
  
  local_60[3] = (a->field_2).field_0.y_crop_width;
  local_60[4] = (a->field_2).field_0.uv_crop_width;
  local_60[5] = local_60[4];
  local_60[0] = (a->field_3).field_0.y_crop_height;
  local_60[1] = (a->field_3).field_0.uv_crop_height;
  local_60[2] = local_60[1];
  local_80[3] = (a->field_4).field_0.y_stride;
  local_80[4] = (a->field_4).field_0.uv_stride;
  local_80[5] = local_80[4];
  local_80[0] = (b->field_4).field_0.y_stride;
  local_80[1] = (b->field_4).field_0.uv_stride;
  local_80[2] = local_80[1];
  local_40 = (double)(0xff << ((char)in_bit_depth - 8U & 0x1f));
  local_48 = CONCAT44(in_register_00000084,in_bit_depth);
  bVar3 = (char)bit_depth - (char)in_bit_depth;
  uVar1 = 0;
  uVar4 = 0;
  local_68 = psnr;
  uVar10 = 0;
  do {
    uVar9 = local_60[uVar10 + 3];
    height = local_60[uVar10];
    uVar11 = height * uVar9;
    local_38 = uVar1;
    if ((a->flags & 8) == 0) {
      uVar1 = get_sse(a->store_buf_adr[uVar10 - 4],local_80[uVar10 + 3],b->store_buf_adr[uVar10 - 4]
                      ,local_80[uVar10],uVar9,height);
LAB_00447a46:
      psnr = local_68;
      local_68->sse[uVar10 + 1] = uVar1;
      local_68->samples[uVar10 + 1] = uVar11;
      if (uVar1 == 0) {
        uVar1 = 0;
        dVar14 = 100.0;
      }
      else {
        auVar16._8_4_ = (int)(uVar1 >> 0x20);
        auVar16._0_8_ = uVar1;
        auVar16._12_4_ = 0x45300000;
        dVar13 = log10(((double)uVar11 * local_40 * local_40) /
                       ((auVar16._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
        dVar14 = 100.0;
        if (dVar13 * 10.0 <= 100.0) {
          dVar14 = dVar13 * 10.0;
        }
      }
    }
    else {
      if (bit_depth == (uint32_t)local_48) {
        uVar1 = highbd_get_sse(a->store_buf_adr[uVar10 - 4],local_80[uVar10 + 3],
                               b->store_buf_adr[uVar10 - 4],local_80[uVar10],uVar9,height);
        goto LAB_00447a46;
      }
      if (0 < (int)height) {
        lVar12 = (long)b->store_buf_adr[uVar10 - 4] * 2;
        lVar6 = (long)a->store_buf_adr[uVar10 - 4] * 2;
        uVar7 = 0;
        uVar1 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = 0;
            do {
              lVar5 = (long)(int)((uint)(*(ushort *)(lVar6 + uVar8 * 2) >> (bVar3 & 0x1f)) -
                                 (uint)(*(ushort *)(lVar12 + uVar8 * 2) >> (bVar3 & 0x1f)));
              uVar1 = uVar1 + lVar5 * lVar5;
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          uVar7 = uVar7 + 1;
          lVar12 = lVar12 + (long)local_80[uVar10] * 2;
          lVar6 = lVar6 + (long)local_80[uVar10 + 3] * 2;
        } while (uVar7 != height);
        goto LAB_00447a46;
      }
      psnr->sse[uVar10 + 1] = 0;
      psnr->samples[uVar10 + 1] = uVar11;
      uVar1 = 0;
      dVar14 = 100.0;
    }
    uVar9 = (int)uVar10 + 1;
    uVar1 = local_38 + uVar1;
    psnr->psnr[uVar10 + 1] = dVar14;
    uVar4 = uVar4 + uVar11;
    uVar10 = (ulong)uVar9;
    if (2 < uVar9) {
      psnr->sse[0] = uVar1;
      psnr->samples[0] = uVar4;
      if (uVar1 == 0) {
        dVar14 = 100.0;
      }
      else {
        auVar17._8_4_ = (int)(uVar1 >> 0x20);
        auVar17._0_8_ = uVar1;
        auVar17._12_4_ = 0x45300000;
        dVar13 = log10(((double)uVar4 * local_40 * local_40) /
                       ((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
        dVar14 = 100.0;
        if (dVar13 * 10.0 <= 100.0) {
          dVar14 = dVar13 * 10.0;
        }
      }
      psnr->psnr[0] = dVar14;
      if (((uint)local_48 < bit_depth) && ((a->flags & 8U) != 0)) {
        dVar14 = (double)(0xff << ((char)bit_depth - 8U & 0x1f));
        lVar12 = 0;
        uVar1 = 0;
        uVar4 = 0;
        do {
          width = *(int *)((long)local_60 + lVar12 + 0xc);
          uVar9 = *(int *)((long)local_60 + lVar12) * width;
          iVar2 = highbd_get_sse(*(uint8_t **)((long)a->store_buf_adr + lVar12 * 2 + -0x20),
                                 *(int *)((long)local_80 + lVar12 + 0xc),
                                 *(uint8_t **)((long)b->store_buf_adr + lVar12 * 2 + -0x20),
                                 *(int *)((long)local_80 + lVar12),width,
                                 *(int *)((long)local_60 + lVar12));
          *(int64_t *)((long)psnr->sse_hbd + lVar12 * 2 + 8) = iVar2;
          *(uint *)((long)psnr->samples_hbd + lVar12 + 4) = uVar9;
          dVar13 = 100.0;
          if (iVar2 != 0) {
            auVar18._8_4_ = (int)((ulong)iVar2 >> 0x20);
            auVar18._0_8_ = iVar2;
            auVar18._12_4_ = 0x45300000;
            dVar15 = log10(((double)uVar9 * dVar14 * dVar14) /
                           ((auVar18._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0)));
            dVar13 = 100.0;
            if (dVar15 * 10.0 <= 100.0) {
              dVar13 = dVar15 * 10.0;
            }
          }
          *(double *)((long)local_68->psnr_hbd + lVar12 * 2 + 8) = dVar13;
          uVar1 = uVar1 + iVar2;
          uVar4 = uVar4 + uVar9;
          lVar12 = lVar12 + 4;
          psnr = local_68;
        } while (lVar12 != 0xc);
        local_68->sse_hbd[0] = uVar1;
        local_68->samples_hbd[0] = uVar4;
        if (uVar1 == 0) {
          dVar14 = 100.0;
        }
        else {
          auVar19._8_4_ = (int)(uVar1 >> 0x20);
          auVar19._0_8_ = uVar1;
          auVar19._12_4_ = 0x45300000;
          dVar13 = log10(((double)uVar4 * dVar14 * dVar14) /
                         ((auVar19._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
          dVar14 = 100.0;
          if (dVar13 * 10.0 <= 100.0) {
            dVar14 = dVar13 * 10.0;
          }
        }
        local_68->psnr_hbd[0] = dVar14;
      }
      return;
    }
  } while( true );
}

Assistant:

void aom_calc_highbd_psnr(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, PSNR_STATS *psnr,
                          uint32_t bit_depth, uint32_t in_bit_depth) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  const int widths[3] = { a->y_crop_width, a->uv_crop_width, a->uv_crop_width };
  const int heights[3] = { a->y_crop_height, a->uv_crop_height,
                           a->uv_crop_height };
  const int a_strides[3] = { a->y_stride, a->uv_stride, a->uv_stride };
  const int b_strides[3] = { b->y_stride, b->uv_stride, b->uv_stride };
  int i;
  uint64_t total_sse = 0;
  uint32_t total_samples = 0;
#if CONFIG_LIBVMAF_PSNR_PEAK
  double peak = (double)(255 << (in_bit_depth - 8));
#else
  double peak = (double)((1 << in_bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
  const unsigned int input_shift = bit_depth - in_bit_depth;

  for (i = 0; i < 3; ++i) {
    const int w = widths[i];
    const int h = heights[i];
    const uint32_t samples = w * h;
    uint64_t sse;
    if (a->flags & YV12_FLAG_HIGHBITDEPTH) {
      if (input_shift) {
        sse = highbd_get_sse_shift(a->buffers[i], a_strides[i], b->buffers[i],
                                   b_strides[i], w, h, input_shift);
      } else {
        sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                             b_strides[i], w, h);
      }
    } else {
      sse = get_sse(a->buffers[i], a_strides[i], b->buffers[i], b_strides[i], w,
                    h);
    }
    psnr->sse[1 + i] = sse;
    psnr->samples[1 + i] = samples;
    psnr->psnr[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);

    total_sse += sse;
    total_samples += samples;
  }

  psnr->sse[0] = total_sse;
  psnr->samples[0] = total_samples;
  psnr->psnr[0] =
      aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);

  // Compute PSNR based on stream bit depth
  if ((a->flags & YV12_FLAG_HIGHBITDEPTH) && (in_bit_depth < bit_depth)) {
#if CONFIG_LIBVMAF_PSNR_PEAK
    peak = (double)(255 << (bit_depth - 8));
#else
    peak = (double)((1 << bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
    total_sse = 0;
    total_samples = 0;
    for (i = 0; i < 3; ++i) {
      const int w = widths[i];
      const int h = heights[i];
      const uint32_t samples = w * h;
      uint64_t sse;
      sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                           b_strides[i], w, h);
      psnr->sse_hbd[1 + i] = sse;
      psnr->samples_hbd[1 + i] = samples;
      psnr->psnr_hbd[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);
      total_sse += sse;
      total_samples += samples;
    }

    psnr->sse_hbd[0] = total_sse;
    psnr->samples_hbd[0] = total_samples;
    psnr->psnr_hbd[0] =
        aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);
  }
}